

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O2

int import_ssh1(Filename *filename,int type,RSAKey *key,char *passphrase,char **errmsg_p)

{
  LoadedFile *lf;
  
  lf = lf_load_keyfile(filename,errmsg_p);
  if (lf != (LoadedFile *)0x0) {
    lf_free(lf);
  }
  return 0;
}

Assistant:

int import_ssh1(const Filename *filename, int type,
                RSAKey *key, char *passphrase, const char **errmsg_p)
{
    LoadedFile *lf = lf_load_keyfile(filename, errmsg_p);
    if (!lf)
        return false;

    int toret = import_ssh1_s(BinarySource_UPCAST(lf),
                              type, key, passphrase, errmsg_p);
    lf_free(lf);
    return toret;
}